

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O3

ostream * __thiscall
dynamicgraph::SignalPtr<double,_int>::writeGraph(SignalPtr<double,_int> *this,ostream *os)

{
  int iVar1;
  SignalBase<int> *pSVar2;
  ostream *poVar3;
  string itNodeName;
  string itLocalName;
  string LeaderNodeName;
  string LeaderLocalName;
  char *local_b0;
  long local_a8;
  char local_a0;
  undefined7 uStack_9f;
  char *local_90;
  long local_88;
  char local_80;
  undefined7 uStack_7f;
  string local_70;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  SignalBase<int>::ExtractNodeAndLocalNames
            ((SignalBase<int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]),
             &local_50,&local_70);
  iVar1 = (*this->_vptr_SignalPtr[6])(this);
  if (((char)iVar1 != '\0') &&
     (this->signalPtr !=
      (Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]))) {
    local_88 = 0;
    local_80 = '\0';
    local_a8 = 0;
    local_a0 = '\0';
    local_b0 = &local_a0;
    local_90 = &local_80;
    pSVar2 = getAbstractPtr(this);
    (*pSVar2->_vptr_SignalBase[0x16])(pSVar2,&local_90,&local_b0);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\t\"",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,local_b0,local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" -> \"",6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t [ headlabel = \"",0x11);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" , taillabel = \"",0x11);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"\", fontsize=7, fontcolor=red ]",0x1e);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return os;
}

Assistant:

std::ostream &SignalPtr<T, Time>::writeGraph(std::ostream &os) const {
  std::string LeaderLocalName;
  std::string LeaderNodeName;
  Signal<T, Time>::ExtractNodeAndLocalNames(LeaderLocalName, LeaderNodeName);
  if (isAbstractPluged() && !autoref()) {
    std::string itLocalName, itNodeName;
    getAbstractPtr()->ExtractNodeAndLocalNames(itLocalName, itNodeName);
    os << "\t\"" << itNodeName << "\" -> \"" << LeaderNodeName << "\""
       << std::endl
       << "\t [ headlabel = \"" << LeaderLocalName << "\" , taillabel = \""
       << itLocalName << "\", fontsize=7, fontcolor=red ]" << std::endl;
  }
  return os;
}